

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_connection.h
# Opt level: O0

void __thiscall blcl::net::connection<MsgType>::write_header(connection<MsgType> *this)

{
  message<MsgType> *data;
  anon_class_8_1_8991fb9c_for_handler_ local_28;
  const_buffer local_20;
  connection<MsgType> *local_10;
  connection<MsgType> *this_local;
  
  local_10 = this;
  data = tsqueue<blcl::net::message<MsgType>_>::front(&this->outgoing_messages_);
  local_20 = (const_buffer)asio::buffer(data,8);
  local_28.this = this;
  asio::
  async_write<asio::basic_stream_socket<asio::ip::tcp,_asio::any_io_executor>,_asio::const_buffers_1,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Swung0x48[P]SimpleRealTimeNetworking_NetCommon_net_connection_h:133:17)>
            (&this->socket_,(const_buffers_1 *)&local_20,&local_28,0);
  return;
}

Assistant:

void write_header() {
            asio::async_write(socket_, asio::buffer(&outgoing_messages_.front().header, sizeof(message_header<T>)),
                [this](asio::error_code ec, std::size_t length) {
                    if (!ec) {
                        if (outgoing_messages_.front().body.size() > 0) {
                            write_body();
                        } else {
                            outgoing_messages_.pop_front();
                            if (!outgoing_messages_.empty())
                                write_header();
                        }
                    } else {
                        std::cout << "[WARN] " << id_ << ": Write header failed.\n";
                        std::cout << "[WARN] " << id_ << ": " << ec.message() << "\n";
                        socket_.close();
                    }
            });
        }